

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O1

void __thiscall icu_63::VTimeZone::VTimeZone(VTimeZone *this,VTimeZone *source)

{
  UnicodeString *this_00;
  int iVar1;
  undefined4 extraout_var;
  UVector *pUVar2;
  long *plVar3;
  void *obj;
  UnicodeString *that;
  int index;
  bool bVar4;
  UErrorCode status;
  UErrorCode local_4c;
  UnicodeString *local_48;
  UnicodeString *local_40;
  UnicodeString *local_38;
  
  BasicTimeZone::BasicTimeZone(&this->super_BasicTimeZone,&source->super_BasicTimeZone);
  (this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject =
       (_func_int **)&PTR__VTimeZone_003b26f0;
  this_00 = &this->tzurl;
  this->tz = (BasicTimeZone *)0x0;
  this->vtzlines = (UVector *)0x0;
  UnicodeString::UnicodeString(this_00,&source->tzurl);
  this->lastmod = source->lastmod;
  UnicodeString::UnicodeString(&this->olsonzid,&source->olsonzid);
  that = &source->icutzver;
  UnicodeString::UnicodeString(&this->icutzver,that);
  if (source->tz != (BasicTimeZone *)0x0) {
    iVar1 = (*(source->tz->super_TimeZone).super_UObject._vptr_UObject[0xc])();
    this->tz = (BasicTimeZone *)CONCAT44(extraout_var,iVar1);
  }
  if (source->vtzlines != (UVector *)0x0) {
    local_4c = U_ZERO_ERROR;
    iVar1 = source->vtzlines->count;
    local_40 = &this->olsonzid;
    local_38 = &this->icutzver;
    pUVar2 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)that);
    local_48 = this_00;
    if (pUVar2 == (UVector *)0x0) {
      pUVar2 = (UVector *)0x0;
    }
    else {
      UVector::UVector(pUVar2,uprv_deleteUObject_63,uhash_compareUnicodeString_63,iVar1,&local_4c);
    }
    this->vtzlines = pUVar2;
    if (0 < iVar1 && local_4c < U_ILLEGAL_ARGUMENT_ERROR) {
      index = 0;
      do {
        plVar3 = (long *)UVector::elementAt(source->vtzlines,index);
        pUVar2 = this->vtzlines;
        obj = (void *)(**(code **)(*plVar3 + 0x38))(plVar3);
        UVector::addElement(pUVar2,obj,&local_4c);
        if (U_ZERO_ERROR < local_4c) break;
        bVar4 = iVar1 + -1 != index;
        index = index + 1;
      } while (bVar4);
    }
    if ((U_ZERO_ERROR < local_4c) && (this->vtzlines != (UVector *)0x0)) {
      (*(this->vtzlines->super_UObject)._vptr_UObject[1])();
    }
  }
  return;
}

Assistant:

VTimeZone::VTimeZone(const VTimeZone& source)
:   BasicTimeZone(source), tz(NULL), vtzlines(NULL),
    tzurl(source.tzurl), lastmod(source.lastmod),
    olsonzid(source.olsonzid), icutzver(source.icutzver) {
    if (source.tz != NULL) {
        tz = (BasicTimeZone*)source.tz->clone();
    }
    if (source.vtzlines != NULL) {
        UErrorCode status = U_ZERO_ERROR;
        int32_t size = source.vtzlines->size();
        vtzlines = new UVector(uprv_deleteUObject, uhash_compareUnicodeString, size, status);
        if (U_SUCCESS(status)) {
            for (int32_t i = 0; i < size; i++) {
                UnicodeString *line = (UnicodeString*)source.vtzlines->elementAt(i);
                vtzlines->addElement(line->clone(), status);
                if (U_FAILURE(status)) {
                    break;
                }
            }
        }
        if (U_FAILURE(status) && vtzlines != NULL) {
            delete vtzlines;
        }
    }
}